

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt0.c
# Opt level: O0

HCOSE_ENCRYPT COSE_Encrypt_Init_From_Object(cn_cbor *cbor,cose_errback *perr)

{
  _Bool _Var1;
  undefined1 local_2c [8];
  cose_errback error;
  COSE_Encrypt *pobj;
  cose_errback *perr_local;
  cn_cbor *cbor_local;
  
  memset(local_2c,0,4);
  pobj = (COSE_Encrypt *)perr;
  if (perr == (cose_errback *)0x0) {
    pobj = (COSE_Encrypt *)local_2c;
  }
  register0x00000000 = (COSE_Encrypt *)calloc(1,0x70);
  if (register0x00000000 == (COSE_Encrypt *)0x0) {
    (pobj->m_message).m_flags = COSE_INIT_FLAGS_NO_CBOR_TAG|COSE_INIT_FLAGS_DETACHED_CONTENT;
  }
  else {
    _Var1 = _COSE_Init_From_Object((COSE *)register0x00000000,cbor,(cose_errback *)pobj);
    if (_Var1) {
      _COSE_InsertInList(&EncryptRoot,&stack0xffffffffffffffd8->m_message);
      return (HCOSE_ENCRYPT)stack0xffffffffffffffd8;
    }
  }
  if (stack0xffffffffffffffd8 != (COSE_Encrypt *)0x0) {
    _COSE_Encrypt_Release(stack0xffffffffffffffd8);
    free(stack0xffffffffffffffd8);
  }
  return (HCOSE_ENCRYPT)0x0;
}

Assistant:

HCOSE_ENCRYPT COSE_Encrypt_Init_From_Object(cn_cbor * cbor, CBOR_CONTEXT_COMMA cose_errback * perr)
{
    COSE_Encrypt * pobj;

    cose_errback error = { 0 };
    if (perr == NULL) perr = &error;

    pobj = (COSE_Encrypt *) COSE_CALLOC(1, sizeof(COSE_Encrypt), context);
    if (pobj == NULL) {
        perr->err = COSE_ERR_OUT_OF_MEMORY;
    errorReturn:
        if (pobj != NULL) {
            _COSE_Encrypt_Release(pobj);
            COSE_FREE(pobj, context);
        }
        return NULL;
    }

    if (!_COSE_Init_From_Object(&pobj->m_message, cbor, CBOR_CONTEXT_PARAM_COMMA perr)) {
        goto errorReturn;
    }

    _COSE_InsertInList(&EncryptRoot, &pobj->m_message);

    return(HCOSE_ENCRYPT) pobj;
    
}